

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O2

void lysc_unres_dflt_free(ly_ctx *ctx,lysc_unres_dflt *r)

{
  lysp_qname *plVar1;
  uint64_t c__;
  ulong uVar2;
  long lVar3;
  
  if (r->dflt == (lysp_qname *)0x0) {
    lVar3 = 0;
    uVar2 = 0;
    while (plVar1 = r->dflts, plVar1 != (lysp_qname *)0x0) {
      if (*(ulong *)&plVar1[-1].flags <= uVar2) {
        plVar1 = (lysp_qname *)&plVar1[-1].flags;
        goto LAB_001418a7;
      }
      lysp_qname_free(ctx,(lysp_qname *)((long)&plVar1->str + lVar3));
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x18;
    }
  }
  else {
    if (r->dflts != (lysp_qname *)0x0) {
      __assert_fail("!r->dflt || !r->dflts",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                    ,0xd1,
                    "void lysc_unres_dflt_free(const struct ly_ctx *, struct lysc_unres_dflt *)");
    }
    lysp_qname_free(ctx,r->dflt);
    plVar1 = r->dflt;
LAB_001418a7:
    free(plVar1);
  }
  free(r);
  return;
}

Assistant:

static void
lysc_unres_dflt_free(const struct ly_ctx *ctx, struct lysc_unres_dflt *r)
{
    assert(!r->dflt || !r->dflts);
    if (r->dflt) {
        lysp_qname_free((struct ly_ctx *)ctx, r->dflt);
        free(r->dflt);
    } else {
        FREE_ARRAY((struct ly_ctx *)ctx, r->dflts, lysp_qname_free);
    }
    free(r);
}